

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_fixupbc(uint8_t *p)

{
  uint8_t local_1b;
  uint8_t local_19;
  uint local_18;
  uint8_t rb;
  uint8_t rc;
  uint8_t ra;
  uint8_t op;
  uint32_t sizebc;
  uint32_t i;
  uint8_t *p_local;
  
  _sizebc = p + 4;
  _sizebc = libdef_uleb128(_sizebc,&local_18);
  _sizebc = libdef_uleb128(_sizebc,&local_18);
  _sizebc = libdef_uleb128(_sizebc,&local_18);
  for (_rb = 0; _rb < local_18; _rb = _rb + 1) {
    local_19 = *_sizebc;
    local_1b = _sizebc[2];
    if ((local_19 == '\x10') && (local_1b == '\x0e')) {
      local_19 = '\x11';
      local_1b = '\x0f';
    }
    *_sizebc = local_19;
    _sizebc[1] = _sizebc[1];
    _sizebc[2] = local_1b;
    _sizebc[3] = _sizebc[3];
    _sizebc = _sizebc + 4;
  }
  return;
}

Assistant:

static void libdef_fixupbc(uint8_t *p)
{
  uint32_t i, sizebc;
  p += 4;
  p = libdef_uleb128(p, &sizebc);
  p = libdef_uleb128(p, &sizebc);
  p = libdef_uleb128(p, &sizebc);
  for (i = 0; i < sizebc; i++, p += 4) {
    uint8_t op = p[libbc_endian ? 3 : 0];
    uint8_t ra = p[libbc_endian ? 2 : 1];
    uint8_t rc = p[libbc_endian ? 1 : 2];
    uint8_t rb = p[libbc_endian ? 0 : 3];
    if (!LJ_DUALNUM && op == BC_ISTYPE && rc == ~LJ_TNUMX+1) {
      op = BC_ISNUM; rc++;
    }
    p[LJ_ENDIAN_SELECT(0, 3)] = op;
    p[LJ_ENDIAN_SELECT(1, 2)] = ra;
    p[LJ_ENDIAN_SELECT(2, 1)] = rc;
    p[LJ_ENDIAN_SELECT(3, 0)] = rb;
  }
}